

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&>
                  *this,vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *container,MatchResultListener *listener)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  MatchMatrix local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  UnorderedElementsAreMatcherImpl<std::vector<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>,std::allocator<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>>>const&>
  ::
  AnalyzeElements<__gnu_cxx::__normal_iterator<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>const*,std::vector<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>,std::allocator<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>>>>>
            (&local_38,
             (UnorderedElementsAreMatcherImpl<std::vector<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>,std::allocator<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>>>const&>
              *)this,(container->
                     super__Vector_base<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
             (container->
             super__Vector_base<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,&local_58,listener);
  bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,&local_58,&local_38,listener);
  if (bVar1) {
    bVar1 = UnorderedElementsAreMatcherImplBase::FindPairing
                      (&this->super_UnorderedElementsAreMatcherImplBase,&local_38,listener);
  }
  else {
    bVar1 = false;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&local_38.matched_.super__Vector_base<char,_std::allocator<char>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return bVar1;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }